

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O0

asn_enc_rval_t *
OCTET_STRING_encode_der
          (asn_TYPE_descriptor_t *td,void *sptr,int tag_mode,ber_tlv_tag_t tag,
          asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  int in_ECX;
  long *in_RDX;
  asn_TYPE_descriptor_t *in_RSI;
  char *pcVar2;
  asn_enc_rval_t *in_RDI;
  ber_tlv_tag_t in_R8D;
  asn_app_consume_bytes_f *in_R9;
  void *in_stack_00000008;
  asn_enc_rval_t *tmp_error;
  uint8_t b_1;
  uint8_t b;
  int fix_last_byte;
  asn_OS_Subvariant type_variant;
  BIT_STRING_t *st;
  asn_OCTET_STRING_specifics_t *specs;
  asn_enc_rval_t er;
  char *local_78;
  asn_OCTET_STRING_specifics_t *local_70;
  byte local_52;
  byte local_51;
  int local_50;
  asn_OS_Subvariant local_4c;
  long *local_48;
  asn_OCTET_STRING_specifics_t *local_40;
  long local_38;
  asn_app_consume_bytes_f *local_20;
  ber_tlv_tag_t local_18;
  int local_14;
  long *local_10;
  asn_TYPE_descriptor_t *local_8;
  
  if (in_RSI->specifics == (void *)0x0) {
    local_70 = &asn_DEF_OCTET_STRING_specs;
  }
  else {
    local_70 = (asn_OCTET_STRING_specifics_t *)in_RSI->specifics;
  }
  local_40 = local_70;
  local_4c = local_70->subvariant;
  local_50 = 0;
  pcVar2 = "Encoding";
  if (in_R9 != (asn_app_consume_bytes_f *)0x0) {
    pcVar2 = "Estimating";
  }
  local_48 = in_RDX;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  ASN_DEBUG("%s %s as OCTET STRING",pcVar2,in_RSI->name);
  if ((local_4c == ASN_OSUBV_ANY) && (local_14 != 1)) {
    local_38 = 0;
  }
  else {
    local_38 = der_write_tags(local_8,(long)(int)((uint)(local_4c == ASN_OSUBV_BIT) +
                                                 (int)local_48[1]),local_14,
                              (uint)(local_4c == ASN_OSUBV_ANY),local_18,local_20,in_stack_00000008)
    ;
    if (local_38 == -1) {
      in_RDI->encoded = -1;
      in_RDI->failed_type = local_8;
      in_RDI->structure_ptr = local_10;
      return in_RDI;
    }
  }
  if (local_20 == (asn_app_consume_bytes_f *)0x0) {
    in_RDI->encoded = (int)((uint)(local_4c == ASN_OSUBV_BIT) + (int)local_48[1]) + local_38;
    in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
    in_RDI->structure_ptr = (void *)0x0;
    return in_RDI;
  }
  if (local_4c == ASN_OSUBV_BIT) {
    local_51 = (byte)*(uint *)((long)local_48 + 0xc) & 7;
    if (((*(uint *)((long)local_48 + 0xc) & 7) != 0) && ((int)local_48[1] != 0)) {
      local_50 = 1;
    }
    iVar1 = (*local_20)(&local_51,1,in_stack_00000008);
    if (iVar1 < 0) goto LAB_001640d4;
    local_38 = local_38 + 1;
  }
  iVar1 = (*local_20)((void *)*local_48,(long)((int)local_48[1] - local_50),in_stack_00000008);
  if (iVar1 < 0) {
LAB_001640d4:
    in_RDI->encoded = -1;
    in_RDI->failed_type = local_8;
    in_RDI->structure_ptr = local_10;
    if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
      local_78 = "";
    }
    else {
      local_78 = local_8->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_78);
    return in_RDI;
  }
  if (local_50 != 0) {
    local_52 = *(byte *)(*local_48 + (long)((int)local_48[1] + -1)) &
               (byte)(0xff << ((byte)*(undefined4 *)((long)local_48 + 0xc) & 0x1f));
    iVar1 = (*local_20)(&local_52,1,in_stack_00000008);
    if (iVar1 < 0) goto LAB_001640d4;
  }
  in_RDI->encoded = (int)local_48[1] + local_38;
  in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
  in_RDI->structure_ptr = (void *)0x0;
  return in_RDI;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_der(asn_TYPE_descriptor_t *td, void *sptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er;
	asn_OCTET_STRING_specifics_t *specs = td->specifics
				? (asn_OCTET_STRING_specifics_t *)td->specifics
				: &asn_DEF_OCTET_STRING_specs;
	BIT_STRING_t *st = (BIT_STRING_t *)sptr;
	enum asn_OS_Subvariant type_variant = specs->subvariant;
	int fix_last_byte = 0;

	ASN_DEBUG("%s %s as OCTET STRING",
		cb?"Estimating":"Encoding", td->name);

	/*
	 * Write tags.
	 */
	if(type_variant != ASN_OSUBV_ANY || tag_mode == 1) {
		er.encoded = der_write_tags(td,
				(type_variant == ASN_OSUBV_BIT) + st->size,
			tag_mode, type_variant == ASN_OSUBV_ANY, tag,
			cb, app_key);
		if(er.encoded == -1) {
			er.failed_type = td;
			er.structure_ptr = sptr;
			return er;
		}
	} else {
		/* Disallow: [<tag>] IMPLICIT ANY */
		assert(type_variant != ASN_OSUBV_ANY || tag_mode != -1);
		er.encoded = 0;
	}

	if(!cb) {
		er.encoded += (type_variant == ASN_OSUBV_BIT) + st->size;
		ASN__ENCODED_OK(er);
	}

	/*
	 * Prepare to deal with the last octet of BIT STRING.
	 */
	if(type_variant == ASN_OSUBV_BIT) {
		uint8_t b = st->bits_unused & 0x07;
		if(b && st->size) fix_last_byte = 1;
		ASN__CALLBACK(&b, 1);
		er.encoded++;
	}

	/* Invoke callback for the main part of the buffer */
	ASN__CALLBACK(st->buf, st->size - fix_last_byte);

	/* The last octet should be stripped off the unused bits */
	if(fix_last_byte) {
		uint8_t b = st->buf[st->size-1] & (0xff << st->bits_unused);
		ASN__CALLBACK(&b, 1);
	}

	er.encoded += st->size;
	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}